

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O2

cuddPathPair getLargest(DdNode *root,st__table *visited)

{
  DdNode *root_00;
  int iVar1;
  int iVar2;
  cuddPathPair *in_RAX;
  cuddPathPair cVar3;
  cuddPathPair cVar4;
  int iVar5;
  DdNode *key;
  cuddPathPair *my_pair;
  
  key = (DdNode *)((ulong)root & 0xfffffffffffffffe);
  my_pair = in_RAX;
  iVar1 = st__lookup(visited,(char *)key,(char **)&my_pair);
  if (iVar1 == 0) {
    if (key->index == 0x7fffffff) {
      iVar1 = 0;
      iVar5 = 1000000;
      if (zero == key) {
        iVar1 = 1000000;
        iVar5 = 0;
      }
    }
    else {
      root_00 = (key->type).kids.E;
      cVar4 = getLargest((key->type).kids.T,visited);
      cVar3 = getLargest(root_00,visited);
      iVar1 = cVar4.pos;
      if (cVar3.pos < cVar4.pos) {
        iVar1 = cVar3.pos;
      }
      iVar5 = cVar4.neg;
      if (cVar3.neg < cVar4.neg) {
        iVar5 = cVar3.neg;
      }
      iVar1 = iVar1 + 1;
      iVar5 = iVar5 + 1;
    }
    my_pair = (cuddPathPair *)malloc(8);
    if (my_pair == (cuddPathPair *)0x0) {
      iVar2 = iVar5;
      if (((ulong)root & 1) == 0) {
        iVar2 = iVar1;
        iVar1 = iVar5;
      }
      goto LAB_0066bb36;
    }
    my_pair->pos = iVar1;
    my_pair->neg = iVar5;
    st__insert(visited,(char *)key,(char *)my_pair);
  }
  iVar2 = *(int *)((long)&my_pair->pos + (ulong)(-((uint)root & 1) & 4));
  iVar1 = (&my_pair->pos)[((ulong)root & 1) == 0];
LAB_0066bb36:
  cVar4.neg = iVar1;
  cVar4.pos = iVar2;
  return cVar4;
}

Assistant:

static cuddPathPair
getLargest(
  DdNode * root,
  st__table * visited)
{
    cuddPathPair *my_pair, res_pair, pair_T, pair_E;
    DdNode      *my_root, *T, *E;

    my_root = Cudd_Regular(root);

    if ( st__lookup(visited, (const char *)my_root, (char **)&my_pair)) {
        if (Cudd_IsComplement(root)) {
            res_pair.pos = my_pair->neg;
            res_pair.neg = my_pair->pos;
        } else {
            res_pair.pos = my_pair->pos;
            res_pair.neg = my_pair->neg;
        }
        return(res_pair);
    }

    /* In the case of a BDD the following test is equivalent to
    ** testing whether the BDD is the constant 1. This formulation,
    ** however, works for ADDs as well, by assuming the usual
    ** dichotomy of 0 and != 0.
    */
    if (cuddIsConstant(my_root)) {
        if (my_root != zero) {
            res_pair.pos = 0;
            res_pair.neg = DD_BIGGY;
        } else {
            res_pair.pos = DD_BIGGY;
            res_pair.neg = 0;
        }
    } else {
        T = cuddT(my_root);
        E = cuddE(my_root);

        pair_T = getLargest(T, visited);
        pair_E = getLargest(E, visited);
        res_pair.pos = ddMin(pair_T.pos, pair_E.pos) + 1;
        res_pair.neg = ddMin(pair_T.neg, pair_E.neg) + 1;
    }

    my_pair = ABC_ALLOC(cuddPathPair, 1);
    if (my_pair == NULL) {      /* simply do not cache this result */
        if (Cudd_IsComplement(root)) {
            int tmp = res_pair.pos;
            res_pair.pos = res_pair.neg;
            res_pair.neg = tmp;
        }
        return(res_pair);
    }
    my_pair->pos = res_pair.pos;
    my_pair->neg = res_pair.neg;

    /* Caching may fail without affecting correctness. */
    st__insert(visited, (char *)my_root, (char *)my_pair);
    if (Cudd_IsComplement(root)) {
        res_pair.pos = my_pair->neg;
        res_pair.neg = my_pair->pos;
    } else {
        res_pair.pos = my_pair->pos;
        res_pair.neg = my_pair->neg;
    }
    return(res_pair);

}